

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

void lj_debug_addloc(lua_State *L,char *msg,cTValue *frame,cTValue *nextframe)

{
  uint uVar1;
  ulong uVar2;
  GCfunc *fn;
  char buf [60];
  char acStack_68 [72];
  
  if ((frame != (cTValue *)0x0) && (fn = (GCfunc *)(ulong)(frame->u32).lo, (fn->c).ffid == '\0')) {
    uVar1 = lj_debug_frameline(L,fn,nextframe);
    if (-1 < (int)uVar1) {
      uVar2 = (ulong)(fn->c).pc.ptr32;
      lj_debug_shortname(acStack_68,(GCstr *)(ulong)*(uint *)(uVar2 - 0x18),
                         *(BCLine *)(uVar2 - 0x14));
      lj_strfmt_pushf(L,"%s:%d: %s",acStack_68,(ulong)uVar1,msg);
      return;
    }
  }
  lj_strfmt_pushf(L,"%s",msg);
  return;
}

Assistant:

void lj_debug_addloc(lua_State *L, const char *msg,
		     cTValue *frame, cTValue *nextframe)
{
  if (frame) {
    GCfunc *fn = frame_func(frame);
    if (isluafunc(fn)) {
      BCLine line = lj_debug_frameline(L, fn, nextframe);
      if (line >= 0) {
	GCproto *pt = funcproto(fn);
	char buf[LUA_IDSIZE];
	lj_debug_shortname(buf, proto_chunkname(pt), pt->firstline);
	lj_strfmt_pushf(L, "%s:%d: %s", buf, line, msg);
	return;
      }
    }
  }
  lj_strfmt_pushf(L, "%s", msg);
}